

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void neg_shift_sse4_1(__m128i in0,__m128i in1,__m128i *out0,__m128i *out1,__m128i *clamp_lo,
                     __m128i *clamp_hi,int shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_XMM0_Da;
  int iVar4;
  uint uVar5;
  int in_XMM0_Db;
  int iVar6;
  uint uVar7;
  int in_XMM0_Dc;
  int iVar8;
  uint uVar9;
  int in_XMM0_Dd;
  int iVar10;
  uint uVar11;
  int in_XMM1_Da;
  int in_XMM1_Db;
  int in_XMM1_Dc;
  int in_XMM1_Dd;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  
  iVar13 = (1 << ((byte)out0 & 0x1f)) >> 1;
  auVar12 = ZEXT416((uint)out0);
  iVar4 = in_XMM0_Da + iVar13 >> auVar12;
  iVar6 = in_XMM0_Db + iVar13 >> auVar12;
  iVar8 = in_XMM0_Dc + iVar13 >> auVar12;
  iVar10 = in_XMM0_Dd + iVar13 >> auVar12;
  iVar14 = iVar13 - in_XMM1_Da >> auVar12;
  iVar16 = iVar13 - in_XMM1_Db >> auVar12;
  iVar18 = iVar13 - in_XMM1_Dc >> auVar12;
  iVar20 = iVar13 - in_XMM1_Dd >> auVar12;
  iVar13 = *(int *)in1[0];
  iVar1 = *(int *)(in1[0] + 4);
  iVar2 = *(int *)(in1[0] + 8);
  iVar3 = *(int *)(in1[0] + 0xc);
  uVar5 = (uint)(iVar4 < iVar13) * iVar13 | (uint)(iVar4 >= iVar13) * iVar4;
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  iVar4 = *(int *)in1[1];
  iVar6 = *(int *)(in1[1] + 4);
  iVar8 = *(int *)(in1[1] + 8);
  iVar10 = *(int *)(in1[1] + 0xc);
  uVar15 = (uint)(iVar14 < iVar13) * iVar13 | (uint)(iVar14 >= iVar13) * iVar14;
  uVar17 = (uint)(iVar16 < iVar1) * iVar1 | (uint)(iVar16 >= iVar1) * iVar16;
  uVar19 = (uint)(iVar18 < iVar2) * iVar2 | (uint)(iVar18 >= iVar2) * iVar18;
  uVar21 = (uint)(iVar20 < iVar3) * iVar3 | (uint)(iVar20 >= iVar3) * iVar20;
  *(uint *)in0[0] = (uint)(iVar4 < (int)uVar5) * iVar4 | (iVar4 >= (int)uVar5) * uVar5;
  *(uint *)(in0[0] + 4) = (uint)(iVar6 < (int)uVar7) * iVar6 | (iVar6 >= (int)uVar7) * uVar7;
  *(uint *)(in0[0] + 8) = (uint)(iVar8 < (int)uVar9) * iVar8 | (iVar8 >= (int)uVar9) * uVar9;
  *(uint *)(in0[0] + 0xc) = (uint)(iVar10 < (int)uVar11) * iVar10 | (iVar10 >= (int)uVar11) * uVar11
  ;
  *(uint *)in0[1] = (uint)(iVar4 < (int)uVar15) * iVar4 | (iVar4 >= (int)uVar15) * uVar15;
  *(uint *)(in0[1] + 4) = (uint)(iVar6 < (int)uVar17) * iVar6 | (iVar6 >= (int)uVar17) * uVar17;
  *(uint *)(in0[1] + 8) = (uint)(iVar8 < (int)uVar19) * iVar8 | (iVar8 >= (int)uVar19) * uVar19;
  *(uint *)(in0[1] + 0xc) = (uint)(iVar10 < (int)uVar21) * iVar10 | (iVar10 >= (int)uVar21) * uVar21
  ;
  return;
}

Assistant:

static void neg_shift_sse4_1(const __m128i in0, const __m128i in1,
                             __m128i *out0, __m128i *out1,
                             const __m128i *clamp_lo, const __m128i *clamp_hi,
                             int shift) {
  __m128i offset = _mm_set1_epi32((1 << shift) >> 1);
  __m128i a0 = _mm_add_epi32(offset, in0);
  __m128i a1 = _mm_sub_epi32(offset, in1);

  a0 = _mm_sra_epi32(a0, _mm_cvtsi32_si128(shift));
  a1 = _mm_sra_epi32(a1, _mm_cvtsi32_si128(shift));

  a0 = _mm_max_epi32(a0, *clamp_lo);
  a0 = _mm_min_epi32(a0, *clamp_hi);
  a1 = _mm_max_epi32(a1, *clamp_lo);
  a1 = _mm_min_epi32(a1, *clamp_hi);

  *out0 = a0;
  *out1 = a1;
}